

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O0

size_t __thiscall baryonyx::bit_array_hash::operator()(bit_array_hash *this,bit_array *array)

{
  underlying_type __val;
  size_t sVar1;
  hash<unsigned_long> local_29;
  int local_28;
  int local_24;
  int e;
  int i;
  size_t ret;
  bit_array *array_local;
  bit_array_hash *this_local;
  
  _e = 0;
  local_24 = 0;
  ret = (size_t)array;
  array_local = (bit_array *)this;
  local_28 = bit_array_impl::block_size(&array->super_bit_array_impl);
  for (; local_24 != local_28; local_24 = local_24 + 1) {
    __val = bit_array_impl::block((bit_array_impl *)ret,local_24);
    sVar1 = std::hash<unsigned_long>::operator()(&local_29,__val);
    _e = sVar1 + 0x9e3779b9 + _e * 0x40 + (_e >> 2) ^ _e;
  }
  return _e;
}

Assistant:

std::size_t operator()(const bit_array& array) const noexcept
    {
        std::size_t ret{ 0 };

        for (int i = 0, e = array.block_size(); i != e; ++i)
            ret ^=
              std::hash<bit_array_impl::underlying_type>()(array.block(i)) +
              0x9e3779b9 + (ret << 6) + (ret >> 2);

        return ret;
    }